

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

BrotliDecoderResult
duckdb_brotli::SaveErrorCode
          (BrotliDecoderStateInternal *s,BrotliDecoderErrorCode e,size_t consumed_input)

{
  BrotliDecoderResult BVar1;
  
  s->error_code = e;
  s->used_input = s->used_input + consumed_input;
  if ((s->buffer_length != 0) && ((s->br).next_in == (s->br).last_in)) {
    s->buffer_length = 0;
  }
  BVar1 = BROTLI_DECODER_RESULT_ERROR;
  if ((uint)(e + BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE) < 3) {
    BVar1 = e;
  }
  return BVar1;
}

Assistant:

static BROTLI_NOINLINE BrotliDecoderResult SaveErrorCode(BrotliDecoderState *s, BrotliDecoderErrorCode e,
                                                         size_t consumed_input) {
	s->error_code = (int)e;
	s->used_input += consumed_input;
	if ((s->buffer_length != 0) && (s->br.next_in == s->br.last_in)) {
		/* If internal buffer is depleted at last, reset it. */
		s->buffer_length = 0;
	}
	switch (e) {
	case BROTLI_DECODER_SUCCESS:
		return BROTLI_DECODER_RESULT_SUCCESS;

	case BROTLI_DECODER_NEEDS_MORE_INPUT:
		return BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT;

	case BROTLI_DECODER_NEEDS_MORE_OUTPUT:
		return BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT;

	default:
		return BROTLI_DECODER_RESULT_ERROR;
	}
}